

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Action.cpp
# Opt level: O3

int __thiscall
PrintTableStatus::clone
          (PrintTableStatus *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  pointer pcVar1;
  undefined8 *puVar2;
  
  puVar2 = (undefined8 *)operator_new(0x30);
  *puVar2 = &PTR___cxa_pure_virtual_001108a0;
  puVar2[1] = puVar2 + 3;
  pcVar1 = (this->super_BaseAction).errorMsg._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(puVar2 + 1),pcVar1,
             pcVar1 + (this->super_BaseAction).errorMsg._M_string_length);
  *puVar2 = &PTR_act_00110a28;
  puVar2[5] = *(undefined8 *)&(this->super_BaseAction).status;
  return (int)puVar2;
}

Assistant:

BaseAction *PrintTableStatus::clone() {
    return (new PrintTableStatus(*this));
}